

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::TextureViewTestViewClasses::iterate(TextureViewTestViewClasses *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  reference ppVar6;
  uchar *texture_data_ptr;
  uchar *result_view_data_ptr;
  uchar *result_texture_data_ptr;
  uchar *result_bo_data_ptr;
  GLenum view_internalformat;
  GLenum texture_internalformat;
  _internalformat_pair internalformat_pair;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_80;
  pointer local_78;
  undefined1 local_70 [8];
  _compatible_internalformat_pairs internalformat_combinations;
  _compatible_internalformat_pairs_const_iterator internalformat_combination_iterator;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  TextureViewTestViewClasses *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar3);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_texture_view");
  if (!bVar2) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_texture_view is not supported, skipping.",&local_39);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  __gnu_cxx::
  __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::__normal_iterator((__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                       *)&internalformat_combinations.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  TextureViewUtilities::getLegalTextureAndViewInternalformatCombinations();
  local_80._M_current =
       (pair<unsigned_int,_unsigned_int> *)
       std::
       vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)local_70);
  __gnu_cxx::
  __normal_iterator<std::pair<unsigned_int,unsigned_int>const*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
  ::__normal_iterator<std::pair<unsigned_int,unsigned_int>*>
            ((__normal_iterator<std::pair<unsigned_int,unsigned_int>const*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
              *)&local_78,&local_80);
  internalformat_combinations.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
  while( true ) {
    internalformat_pair =
         (_internalformat_pair)
         std::
         vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)local_70);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                        *)&internalformat_combinations.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                        *)&internalformat_pair);
    if (!bVar2) break;
    ppVar6 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
             ::operator*((__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                          *)&internalformat_combinations.
                             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    view_internalformat = (*ppVar6).first;
    texture_internalformat = (*ppVar6).second;
    initTextureObject(this,true,view_internalformat,texture_internalformat);
    initTextureObject(this,false,view_internalformat,texture_internalformat);
    initBufferObject(this,view_internalformat,texture_internalformat);
    initProgramObject(this,view_internalformat,texture_internalformat);
    (**(code **)(local_18 + 8))(this->m_texture_unit_for_parent_texture);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glActiveTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1ce8);
    (**(code **)(local_18 + 0xb8))(0xde1,this->m_to_id);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1ceb);
    (**(code **)(local_18 + 8))(this->m_texture_unit_for_view_texture);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glActiveTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1cee);
    (**(code **)(local_18 + 0xb8))(0xde1,this->m_view_to_id);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1cf1);
    (**(code **)(local_18 + 0x30))(0);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1cf5);
    (**(code **)(local_18 + 0x538))(0,0,this->m_texture_width * this->m_texture_height);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1cf8);
    (**(code **)(local_18 + 0x638))();
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1cfb);
    texture_data_ptr = (uchar *)(**(code **)(local_18 + 0xcf8))(0x8c8e,35000);
    uVar1 = this->m_view_data_offset;
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1d03);
    verifyResultData(this,view_internalformat,texture_internalformat,texture_data_ptr,
                     texture_data_ptr + uVar1);
    (**(code **)(local_18 + 0x1670))(0x8c8e);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1d0a);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                  *)&internalformat_combinations.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  }
  if ((this->m_has_test_failed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)local_70);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureViewTestViewClasses::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Only execute the test if GL_ARB_texture_view is supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_view"))
	{
		throw tcu::NotSupportedError("GL_ARB_texture_view is not supported, skipping.");
	}

	/* Create all GL objects required to run the test */
	initTest();

	/* Iterate through all valid "texture internalformat + view internalformat" combinations */
	TextureViewUtilities::_compatible_internalformat_pairs_const_iterator internalformat_combination_iterator;
	TextureViewUtilities::_compatible_internalformat_pairs				  internalformat_combinations =
		TextureViewUtilities::getLegalTextureAndViewInternalformatCombinations();

	for (internalformat_combination_iterator = internalformat_combinations.begin();
		 internalformat_combination_iterator != internalformat_combinations.end();
		 internalformat_combination_iterator++)
	{
		TextureViewUtilities::_internalformat_pair internalformat_pair	= *internalformat_combination_iterator;
		glw::GLenum								   texture_internalformat = internalformat_pair.first;
		glw::GLenum								   view_internalformat	= internalformat_pair.second;

		/* Initialize parent texture object storage */
		initTextureObject(true, /* should_init_parent_texture */
						  texture_internalformat, view_internalformat);

		/* Create the texture view */
		initTextureObject(false, /* should_init_parent_texture */
						  texture_internalformat, view_internalformat);

		/* Initialize buffer object storage so that it's large enough to
		 * hold the result data.
		 **/
		initBufferObject(texture_internalformat, view_internalformat);

		/* Create the program object we'll use for the test */
		initProgramObject(texture_internalformat, view_internalformat);

		/* Configure texture bindings */
		gl.activeTexture(m_texture_unit_for_parent_texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

		gl.bindTexture(GL_TEXTURE_2D, m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.activeTexture(m_texture_unit_for_view_texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

		gl.bindTexture(GL_TEXTURE_2D, m_view_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		/* Run the test program */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, m_texture_width * m_texture_height);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

		/* Retrieve the results */
		const unsigned char* result_bo_data_ptr =
			(const unsigned char*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		const unsigned char* result_texture_data_ptr = result_bo_data_ptr;
		const unsigned char* result_view_data_ptr	= result_bo_data_ptr + m_view_data_offset;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

		/* Verify the retrieved values are valid */
		verifyResultData(texture_internalformat, view_internalformat, result_texture_data_ptr, result_view_data_ptr);

		/* Unmap the buffer object */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
	} /* for (all internalformat combinations) */

	if (m_has_test_failed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}